

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

bool __thiscall gui::Slider::handleMouseMove(Slider *this,Vector2f *mouseParent)

{
  Vector2f VVar1;
  bool bVar2;
  undefined1 uVar3;
  Vector2f *pVVar4;
  float local_28;
  
  bVar2 = Widget::handleMouseMove(&this->super_Widget,mouseParent);
  uVar3 = 1;
  if (!bVar2) {
    VVar1 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
    if (this->isDragging_ == true) {
      bVar2 = sf::Mouse::isButtonPressed(Left);
      if (bVar2) {
        pVVar4 = Widget::getOrigin(&this->super_Widget);
        local_28 = VVar1.x;
        updateThumb(this,local_28 + pVVar4->x);
      }
      else {
        this->isDragging_ = false;
        Widget::requestRedraw(&this->super_Widget);
      }
    }
    uVar3 = this->isDragging_;
  }
  return (bool)uVar3;
}

Assistant:

bool Slider::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    if (isDragging_) {
        if (sf::Mouse::isButtonPressed(sf::Mouse::Left)) {
            updateThumb(mouseLocal.x + getOrigin().x);
        } else {
            isDragging_ = false;
            requestRedraw();
        }
    }

    return isDragging_;
}